

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O0

void __thiscall Channel4op::keyOn(Channel4op *this)

{
  Channel4op *this_local;
  
  Operator::keyOn(this->op1);
  Operator::keyOn(this->op2);
  Operator::keyOn(this->op3);
  Operator::keyOn(this->op4);
  (this->super_Channel).feedback[1] = 0.0;
  (this->super_Channel).feedback[0] = 0.0;
  return;
}

Assistant:

void Channel4op::keyOn() {
	op1->keyOn();
	op2->keyOn();
	op3->keyOn();
	op4->keyOn();
	feedback[0] = feedback[1] = 0;
}